

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_shr64v_m68k(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 8) {
    *(ulong *)((long)d + uVar1) = *(ulong *)((long)a + uVar1) >> (*(byte *)((long)b + uVar1) & 0x3f)
    ;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_shr64v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint8_t sh = *(uint64_t *)((char *)b + i) & 63;
        *(uint64_t *)((char *)d + i) = *(uint64_t *)((char *)a + i) >> sh;
    }
    clear_high(d, oprsz, desc);
}